

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall SVGChart::PPlot::DrawPlotBackground(PPlot *this,PRect *inRect,Painter *inPainter)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  string theTitle;
  undefined8 local_50;
  long local_48;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mPlotBackground).mStyle);
  if ((this->mPlotBackground).mTransparent == false) {
    (*inPainter->_vptr_Painter[7])
              (inPainter,(ulong)(this->mPlotBackground).mPlotRegionBackColor.mR,
               (ulong)(this->mPlotBackground).mPlotRegionBackColor.mG,
               (ulong)(this->mPlotBackground).mPlotRegionBackColor.mB);
    (*inPainter->_vptr_Painter[1])
              (inPainter,(ulong)(uint)inRect->mX,(ulong)(uint)inRect->mY,(ulong)(uint)inRect->mW,
               (ulong)(uint)inRect->mH);
  }
  std::__cxx11::string::string((string *)&local_50,(string *)&(this->mPlotBackground).mTitle);
  if (local_48 != 0) {
    iVar4 = (*inPainter->_vptr_Painter[8])(inPainter,local_50);
    lVar1 = inRect->mX;
    lVar2 = inRect->mY;
    lVar3 = inRect->mW;
    iVar5 = (*inPainter->_vptr_Painter[9])(inPainter);
    fVar6 = floorf((float)((double)(lVar3 - iVar4) * 0.5 + (double)lVar1) + 0.5);
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)(int)fVar6,
               (ulong)(uint)(((int)lVar2 - iVar5) + (int)(this->mMargins).mTop),local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool PPlot::DrawPlotBackground (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mPlotBackground.mStyle);

      if (!mPlotBackground.mTransparent) {
        PColor theC = mPlotBackground.mPlotRegionBackColor;
        inPainter.SetFillColor (theC.mR, theC.mG, theC.mB);
        inPainter.FillRect (inRect.mX, inRect.mY, inRect.mW, inRect.mH);
      }
      string theTitle = mPlotBackground.mTitle;
      if (theTitle.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theTitle.c_str ());
        int theX = Round (inRect.mX + (inRect.mW-theW)*0.5);
        int theY = inRect.mY - inPainter.GetFontHeight ()+mMargins.mTop;
        inPainter.DrawText (theX, theY, theTitle.c_str ());
      }
      return true;
    }